

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase92::run(TestCase92 *this)

{
  Reader brand;
  Builder builder_00;
  Builder builder_01;
  Builder builder_02;
  Builder builder_03;
  Builder builder_04;
  Builder builder_05;
  Builder builder_06;
  Builder builder_07;
  Reader reader_00;
  Reader reader_01;
  bool bVar1;
  uint64_t id;
  anon_class_8_1_89912de0 *func;
  ArrayPtr<const_char> AVar2;
  undefined8 in_stack_ffffffffffffec68;
  undefined8 uVar3;
  undefined8 in_stack_ffffffffffffec70;
  Reader local_1298;
  ArrayPtr<const_char> local_1268;
  bool local_1251;
  undefined1 local_1250 [7];
  bool _kj_shouldLog_4;
  ArrayPtr<const_char> local_1220;
  char (*local_1210) [6];
  undefined1 local_1208 [8];
  DebugComparison<const_char_(&)[6],_capnp::Text::Reader> _kjCondition_4;
  int16_t local_11a2;
  int local_11a0;
  bool local_1199;
  undefined1 local_1198 [7];
  bool _kj_shouldLog_3;
  int16_t local_1162;
  int local_1160;
  DebugExpression<int> local_115c;
  undefined1 local_1158 [8];
  DebugComparison<int,_short> _kjCondition_3;
  undefined1 local_1110 [8];
  Reader reader;
  ArrayPtr<const_char> local_1098;
  ArrayPtr<const_char> local_1088;
  Builder local_1078;
  BuilderFor<capnp::DynamicStruct> local_1038;
  Reader local_1008;
  ArrayPtr<const_char> local_fc0;
  ArrayPtr<const_char> local_fb0;
  Builder local_fa0;
  BuilderFor<capnp::DynamicStruct> local_f60;
  Schema local_f30;
  undefined1 local_f28 [8];
  Builder root_4;
  MallocMessageBuilder builder_4;
  Schema local_e00;
  Reader local_df8;
  RawBrandedSchema *local_dc8;
  Schema local_dc0;
  Reader local_db8;
  Schema local_d88;
  Reader local_d80;
  Schema local_d50;
  Schema local_d48;
  StructSchema unionSchema;
  CapTableBuilder *pCStack_d38;
  void *local_d30;
  WirePointer *pWStack_d28;
  undefined8 local_d20;
  undefined1 auStack_ce0 [8];
  Builder root_3;
  MallocMessageBuilder builder_3;
  Schema SStack_bb8;
  bool _kj_shouldLog_2;
  Reader local_bb0;
  Schema local_b80;
  Schema local_b78;
  undefined1 local_b70 [8];
  DebugComparison<capnp::Schema,_capnp::StructSchema_&> _kjCondition_2;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  Reader local_b20;
  Schema local_ae8;
  Schema SStack_ae0;
  SegmentBuilder *local_ad8;
  CapTableBuilder *pCStack_ad0;
  void *local_ac8;
  WirePointer *pWStack_ac0;
  Schema local_ab8;
  undefined1 auStack_ab0 [8];
  Builder root_2;
  MallocMessageBuilder builder_2;
  Schema SStack_988;
  bool _kj_shouldLog_1;
  StructSchema *local_980;
  undefined1 local_978 [8];
  DebugComparison<capnp::StructSchema_&,_capnp::StructSchema> _kjCondition_1;
  Reader local_948;
  Schema local_910;
  Schema local_908;
  StructSchema testListsSchema;
  CapTableBuilder *pCStack_8f8;
  void *local_8f0;
  WirePointer *pWStack_8e8;
  undefined8 local_8e0;
  undefined1 auStack_8a0 [8];
  Builder root_1;
  MallocMessageBuilder builder_1;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  bool local_751;
  undefined1 auStack_750 [7];
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_748;
  DebugExpression<kj::Maybe<kj::Exception>_> local_5b0;
  undefined1 local_418 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  UnknownType aUStack_258 [8];
  UnknownType local_250 [8];
  UnknownType aUStack_248 [8];
  UnknownType local_240 [8];
  UnknownType aUStack_238 [8];
  UnknownType local_230 [64];
  undefined1 auStack_1f0 [8];
  Builder root;
  MallocMessageBuilder builder;
  Schema local_c8;
  Reader local_c0;
  Schema local_80;
  Reader local_78;
  Schema local_48;
  Schema local_40;
  StructSchema schema;
  SchemaLoader loader;
  TestCase92 *this_local;
  
  SchemaLoader::SchemaLoader((SchemaLoader *)&schema);
  local_80.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestAllTypes>();
  Schema::getProto(&local_78,&local_80);
  local_48 = SchemaLoader::load((SchemaLoader *)&schema,&local_78);
  local_40.raw = (RawBrandedSchema *)Schema::asStruct(&local_48);
  local_c8.raw = (RawBrandedSchema *)Schema::from<capnp::schemas::TestEnum_9c8e9318b29d9cd3>();
  Schema::getProto(&local_c0,&local_c8);
  SchemaLoader::load((SchemaLoader *)&schema,&local_c0);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_1f0,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)local_40.raw);
  builder_04.builder.segment = root.builder.segment;
  builder_04.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_04.builder.capTable = root.builder.capTable;
  builder_04.builder.data = root.builder.data;
  builder_04.builder.pointers = root.builder.pointers;
  builder_04.builder.dataSize = (int)in_stack_ffffffffffffec68;
  builder_04.builder.pointerCount = (short)((ulong)in_stack_ffffffffffffec68 >> 0x20);
  builder_04.builder._38_2_ = (short)((ulong)in_stack_ffffffffffffec68 >> 0x30);
  initDynamicTestMessage(builder_04);
  DynamicStruct::Builder::asReader((Reader *)&_kjCondition.result,(Builder *)auStack_1f0);
  reader_00.reader.segment = (SegmentReader *)local_250;
  reader_00.schema.super_Schema.raw = (Schema)(Schema)aUStack_258;
  reader_00.reader.capTable = (CapTableReader *)aUStack_248;
  reader_00.reader.data = (void *)local_240;
  reader_00.reader.pointers = (WirePointer *)aUStack_238;
  reader_00.reader._32_8_ = local_230._0_8_;
  reader_00.reader._40_8_ = in_stack_ffffffffffffec70;
  checkDynamicTestMessage(reader_00);
  _auStack_750 = auStack_1f0;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase92::run()::__0>
            (&local_748,(kj *)auStack_750,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_5b0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_748);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_418,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_5b0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_5b0);
  kj::Maybe<kj::Exception>::~Maybe(&local_748);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_418);
  if (!bVar1) {
    local_751 = kj::_::Debug::shouldLog(ERROR);
    while (local_751 != false) {
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x6c,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.as<TestAllTypes>(); }) != kj::none\", _kjCondition"
                 ,(char (*) [93])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.as<TestAllTypes>(); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_418);
      local_751 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_418);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&builder_1.moreSegments.builder.disposer,
             (MessageBuilder *)&root.builder.dataSize);
  builder_00._builder.capTable = (CapTableBuilder *)local_770;
  builder_00._builder.segment = (SegmentBuilder *)uStack_778;
  builder_00._builder.data = (void *)uStack_768;
  builder_00._builder.pointers = (WirePointer *)local_760;
  builder_00._builder._32_8_ = aUStack_238;
  checkTestMessage(builder_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestAllTypes>
            ((SchemaLoader *)&schema);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root_1.builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_8a0,(MessageBuilder *)&root_1.builder.dataSize,
             (StructSchema)local_40.raw);
  builder_05.builder.segment = root_1.builder.segment;
  builder_05.schema = (StructSchema)(StructSchema)root_1.schema.super_Schema.raw;
  builder_05.builder.capTable = root_1.builder.capTable;
  builder_05.builder.data = root_1.builder.data;
  builder_05.builder.pointers = root_1.builder.pointers;
  builder_05.builder._32_8_ = local_230._0_8_;
  initDynamicTestMessage(builder_05);
  DynamicStruct::Builder::as<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)&testListsSchema,(Builder *)auStack_8a0);
  builder_01._builder.capTable = (CapTableBuilder *)local_8f0;
  builder_01._builder.segment = (SegmentBuilder *)pCStack_8f8;
  builder_01._builder.data = pWStack_8e8;
  builder_01._builder.pointers = (WirePointer *)local_8e0;
  builder_01._builder._32_8_ = root_1.builder.pointers;
  checkTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_1.builder.dataSize);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestListDefaults>
            ((SchemaLoader *)&schema);
  id = typeId<capnproto_test::capnp::test::TestListDefaults,capnproto_test::capnp::test::TestListDefaults::_capnpPrivate>
                 ();
  local_948._reader.dataSize = 0;
  local_948._reader.pointerCount = 0;
  local_948._reader._38_2_ = 0;
  local_948._reader.nestingLimit = 0;
  local_948._reader._44_4_ = 0;
  local_948._reader.data = (void *)0x0;
  local_948._reader.pointers = (WirePointer *)0x0;
  local_948._reader.segment = (SegmentReader *)0x0;
  local_948._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_948);
  Schema::Schema((Schema *)&_kjCondition_1.result);
  brand._reader.capTable = local_948._reader.capTable;
  brand._reader.segment = local_948._reader.segment;
  brand._reader.data = local_948._reader.data;
  brand._reader.pointers = local_948._reader.pointers;
  brand._reader.dataSize = local_948._reader.dataSize;
  brand._reader.pointerCount = local_948._reader.pointerCount;
  brand._reader._38_2_ = local_948._reader._38_2_;
  brand._reader.nestingLimit = local_948._reader.nestingLimit;
  brand._reader._44_4_ = local_948._reader._44_4_;
  local_910 = SchemaLoader::get((SchemaLoader *)&schema,id,brand,(Schema)_kjCondition_1._32_8_);
  local_908.raw = (RawBrandedSchema *)Schema::asStruct(&local_910);
  local_980 = (StructSchema *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StructSchema *)&local_908);
  SStack_988.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestListDefaults>()
  ;
  kj::_::DebugExpression<capnp::StructSchema&>::operator!=
            ((DebugComparison<capnp::StructSchema_&,_capnp::StructSchema> *)local_978,
             (DebugExpression<capnp::StructSchema&> *)&local_980,
             (StructSchema *)&stack0xfffffffffffff678);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_978);
  if (!bVar1) {
    builder_2.moreSegments.builder.disposer._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (builder_2.moreSegments.builder.disposer._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[69],kj::_::DebugComparison<capnp::StructSchema&,capnp::StructSchema>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x83,ERROR,
                 "\"failed: expected \" \"testListsSchema != Schema::from<TestListDefaults>()\", _kjCondition"
                 ,(char (*) [69])
                  "failed: expected testListsSchema != Schema::from<TestListDefaults>()",
                 (DebugComparison<capnp::StructSchema_&,_capnp::StructSchema> *)local_978);
      builder_2.moreSegments.builder.disposer._7_1_ = false;
    }
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root_2.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_ab8.raw = local_908.raw;
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_ab0,(MessageBuilder *)&root_2.builder.dataSize,
             (StructSchema)local_908.raw);
  local_ac8 = root_2.builder.data;
  pWStack_ac0 = root_2.builder.pointers;
  local_ad8 = root_2.builder.segment;
  pCStack_ad0 = root_2.builder.capTable;
  local_ae8.raw = (RawBrandedSchema *)auStack_ab0;
  SStack_ae0 = root_2.schema.super_Schema.raw;
  builder_06.builder.segment = root_2.builder.segment;
  builder_06.schema = (StructSchema)(StructSchema)root_2.schema.super_Schema.raw;
  builder_06.builder.capTable = root_2.builder.capTable;
  builder_06.builder.data = root_2.builder.data;
  builder_06.builder.pointers = root_2.builder.pointers;
  builder_06.builder._32_8_ = local_230._0_8_;
  initDynamicTestLists(builder_06);
  DynamicStruct::Builder::asReader(&local_b20,(Builder *)auStack_ab0);
  reader_01.reader.segment = (SegmentReader *)local_b20.reader.capTable;
  reader_01.schema.super_Schema.raw = (Schema)(Schema)local_b20.reader.segment;
  reader_01.reader.capTable = (CapTableReader *)local_b20.reader.data;
  reader_01.reader.data = local_b20.reader.pointers;
  reader_01.reader.pointers = (WirePointer *)local_b20.reader._32_8_;
  reader_01.reader.dataSize = local_b20.reader.nestingLimit;
  reader_01.reader.pointerCount = local_b20.reader._44_2_;
  reader_01.reader._38_2_ = local_b20.reader._46_2_;
  reader_01.reader._40_8_ = in_stack_ffffffffffffec70;
  checkDynamicTestLists(reader_01);
  DynamicStruct::Builder::as<capnproto_test::capnp::test::TestListDefaults>
            ((Builder *)&_kjCondition_2.result,(Builder *)auStack_ab0);
  builder_02._builder.capTable = (CapTableBuilder *)local_b38;
  builder_02._builder.segment = (SegmentBuilder *)uStack_b40;
  builder_02._builder.data = (void *)uStack_b30;
  builder_02._builder.pointers = (WirePointer *)local_b28;
  builder_02._builder.dataSize = local_b20.reader.dataSize;
  builder_02._builder.pointerCount = local_b20.reader.pointerCount;
  builder_02._builder._38_2_ = local_b20.reader._38_2_;
  checkTestMessage(builder_02);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_2.builder.dataSize);
  SStack_bb8.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestListDefaults>()
  ;
  Schema::getProto(&local_bb0,&stack0xfffffffffffff448);
  local_b80 = SchemaLoader::load((SchemaLoader *)&schema,&local_bb0);
  local_b78.raw =
       (RawBrandedSchema *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_b80);
  kj::_::DebugExpression<capnp::Schema>::operator==
            ((DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_b70,
             (DebugExpression<capnp::Schema> *)&local_b78,(StructSchema *)&local_908);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b70);
  uVar3 = local_b20.reader._40_8_;
  if (!bVar1) {
    builder_3.moreSegments.builder.disposer._7_1_ = kj::_::Debug::shouldLog(ERROR);
    uVar3 = local_b20.reader._40_8_;
    while (builder_3.moreSegments.builder.disposer._7_1_ != false) {
      kj::_::Debug::
      log<char_const(&)[93],kj::_::DebugComparison<capnp::Schema,capnp::StructSchema&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0x8f,ERROR,
                 "\"failed: expected \" \"loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema\", _kjCondition"
                 ,(char (*) [93])
                  "failed: expected loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema"
                 ,(DebugComparison<capnp::Schema,_capnp::StructSchema_&> *)local_b70);
      builder_3.moreSegments.builder.disposer._7_1_ = false;
    }
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root_3.builder.dataSize,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)auStack_ce0,(MessageBuilder *)&root_3.builder.dataSize,
             (StructSchema)local_908.raw);
  builder_07.builder.segment = root_3.builder.segment;
  builder_07.schema = (StructSchema)(StructSchema)root_3.schema.super_Schema.raw;
  builder_07.builder.capTable = root_3.builder.capTable;
  builder_07.builder.data = root_3.builder.data;
  builder_07.builder.pointers = root_3.builder.pointers;
  builder_07.builder.dataSize = (int)uVar3;
  builder_07.builder.pointerCount = SUB82(uVar3,4);
  builder_07.builder._38_2_ = SUB82(uVar3,6);
  initDynamicTestLists(builder_07);
  DynamicStruct::Builder::as<capnproto_test::capnp::test::TestListDefaults>
            ((Builder *)&unionSchema,(Builder *)auStack_ce0);
  builder_03._builder.capTable = (CapTableBuilder *)local_d30;
  builder_03._builder.segment = (SegmentBuilder *)pCStack_d38;
  builder_03._builder.data = pWStack_d28;
  builder_03._builder.pointers = (WirePointer *)local_d20;
  builder_03._builder._32_8_ = root_3.builder.pointers;
  checkTestMessage(builder_03);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_3.builder.dataSize);
  local_d88.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestUnion>();
  Schema::getProto(&local_d80,&local_d88);
  local_d50 = SchemaLoader::load((SchemaLoader *)&schema,&local_d80);
  local_d48.raw = (RawBrandedSchema *)Schema::asStruct(&local_d50);
  local_dc0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestUnion::Union0>()
  ;
  Schema::getProto(&local_db8,&local_dc0);
  local_dc8 = (RawBrandedSchema *)SchemaLoader::load((SchemaLoader *)&schema,&local_db8);
  local_e00.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestUnion::Union1>()
  ;
  Schema::getProto(&local_df8,&local_e00);
  SchemaLoader::load((SchemaLoader *)&schema,&local_df8);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root_4.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_f30.raw = local_d48.raw;
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)local_f28,(MessageBuilder *)&root_4.builder.dataSize,
             (StructSchema)local_d48.raw);
  kj::StringPtr::StringPtr((StringPtr *)&local_fb0,"union0");
  DynamicStruct::Builder::get(&local_fa0,(Builder *)local_f28,(StringPtr)local_fb0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_f60,&local_fa0);
  kj::StringPtr::StringPtr((StringPtr *)&local_fc0,"u0f1s16");
  DynamicValue::Reader::Reader(&local_1008,0x7b);
  DynamicStruct::Builder::set(&local_f60,(StringPtr)local_fc0,&local_1008);
  DynamicValue::Reader::~Reader(&local_1008);
  DynamicValue::Builder::~Builder(&local_fa0);
  kj::StringPtr::StringPtr((StringPtr *)&local_1088,"union1");
  DynamicStruct::Builder::get(&local_1078,(Builder *)local_f28,(StringPtr)local_1088);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_1038,&local_1078);
  kj::StringPtr::StringPtr((StringPtr *)&local_1098,"u1f0sp");
  DynamicValue::Reader::Reader((Reader *)&reader._reader.nestingLimit,"hello");
  DynamicStruct::Builder::set
            (&local_1038,(StringPtr)local_1098,(Reader *)&reader._reader.nestingLimit);
  DynamicValue::Reader::~Reader((Reader *)&reader._reader.nestingLimit);
  DynamicValue::Builder::~Builder(&local_1078);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestUnion>
            ((Builder *)&_kjCondition_3.result,(MessageBuilder *)&root_4.builder.dataSize);
  capnproto_test::capnp::test::TestUnion::Builder::asReader
            ((Reader *)local_1110,(Builder *)&_kjCondition_3.result);
  local_1160 = 0x7b;
  local_115c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1160);
  capnproto_test::capnp::test::TestUnion::Reader::getUnion0
            ((Reader *)local_1198,(Reader *)local_1110);
  local_1162 = capnproto_test::capnp::test::TestUnion::Union0::Reader::getU0f1s16
                         ((Reader *)local_1198);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_1158,&local_115c,&local_1162);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1158);
  if (!bVar1) {
    local_1199 = kj::_::Debug::shouldLog(ERROR);
    while (local_1199 != false) {
      local_11a0 = 0x7b;
      capnproto_test::capnp::test::TestUnion::Reader::getUnion0
                ((Reader *)&_kjCondition_4.result,(Reader *)local_1110);
      local_11a2 = capnproto_test::capnp::test::TestUnion::Union0::Reader::getU0f1s16
                             ((Reader *)&_kjCondition_4.result);
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xa5,ERROR,
                 "\"failed: expected \" \"(123) == (reader.getUnion0().getU0f1s16())\", _kjCondition, 123, reader.getUnion0().getU0f1s16()"
                 ,(char (*) [60])"failed: expected (123) == (reader.getUnion0().getU0f1s16())",
                 (DebugComparison<int,_short> *)local_1158,&local_11a0,&local_11a2);
      local_1199 = false;
    }
  }
  local_1210 = (char (*) [6])
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [6])"hello");
  capnproto_test::capnp::test::TestUnion::Reader::getUnion1
            ((Reader *)local_1250,(Reader *)local_1110);
  local_1220 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f0sp
                         ((Reader *)local_1250);
  kj::_::DebugExpression<char_const(&)[6]>::operator==
            ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_1208,
             (DebugExpression<char_const(&)[6]> *)&local_1210,(Reader *)&local_1220);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1208);
  if (!bVar1) {
    local_1251 = kj::_::Debug::shouldLog(ERROR);
    while (local_1251 != false) {
      capnproto_test::capnp::test::TestUnion::Reader::getUnion1(&local_1298,(Reader *)local_1110);
      AVar2 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f0sp(&local_1298);
      local_1268 = AVar2;
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xa6,ERROR,
                 "\"failed: expected \" \"(\\\"hello\\\") == (reader.getUnion1().getU1f0sp())\", _kjCondition, \"hello\", reader.getUnion1().getU1f0sp()"
                 ,(char (*) [63])"failed: expected (\"hello\") == (reader.getUnion1().getU1f0sp())",
                 (DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)local_1208,
                 (char (*) [6])"hello",(Reader *)&local_1268);
      local_1251 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root_4.builder.dataSize);
  SchemaLoader::~SchemaLoader((SchemaLoader *)&schema);
  return;
}

Assistant:

TEST(SchemaLoader, Use) {
  SchemaLoader loader;

  StructSchema schema = loader.load(Schema::from<TestAllTypes>().getProto()).asStruct();

  // Also have to load TestEnum.
  loader.load(Schema::from<TestEnum>().getProto());

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(schema);

    initDynamicTestMessage(root);
    checkDynamicTestMessage(root.asReader());

    // Can't convert to TestAllTypes because we didn't use loadCompiledTypeAndDependencies().
    EXPECT_ANY_THROW(root.as<TestAllTypes>());

    // But if we reinterpret the raw bytes, it works.
    checkTestMessage(builder.getRoot<TestAllTypes>());
  }

  loader.loadCompiledTypeAndDependencies<TestAllTypes>();

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(schema);

    initDynamicTestMessage(root);

    // Now we can actually cast.
    checkTestMessage(root.as<TestAllTypes>());
  }

  // Let's also test TestListDefaults, but as we do so, let's load the compiled types first, to
  // make sure the opposite order works.

  loader.loadCompiledTypeAndDependencies<TestListDefaults>();
  StructSchema testListsSchema = loader.get(typeId<TestListDefaults>()).asStruct();
  EXPECT_TRUE(testListsSchema != Schema::from<TestListDefaults>());

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(testListsSchema);

    initDynamicTestLists(root);
    checkDynamicTestLists(root.asReader());

    checkTestMessage(root.as<TestListDefaults>());
  }

  EXPECT_TRUE(loader.load(Schema::from<TestListDefaults>().getProto()) == testListsSchema);

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(testListsSchema);

    initDynamicTestLists(root);
    checkTestMessage(root.as<TestListDefaults>());
  }

  // Finally, let's test some unions.
  StructSchema unionSchema = loader.load(Schema::from<TestUnion>().getProto()).asStruct();
  loader.load(Schema::from<TestUnion::Union0>().getProto());
  loader.load(Schema::from<TestUnion::Union1>().getProto());
  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<DynamicStruct>(unionSchema);

    root.get("union0").as<DynamicStruct>().set("u0f1s16", 123);
    root.get("union1").as<DynamicStruct>().set("u1f0sp", "hello");

    auto reader = builder.getRoot<TestUnion>().asReader();
    EXPECT_EQ(123, reader.getUnion0().getU0f1s16());
    EXPECT_EQ("hello", reader.getUnion1().getU1f0sp());
  }
}